

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O0

void ffesum(unsigned_long sum,int complm,char *ascii)

{
  int iVar1;
  char acStack_d8 [8];
  char asc [32];
  int kk;
  int jj;
  int ii;
  int check;
  int ch [4];
  int remainder;
  int quotient;
  int byte;
  unsigned_long value;
  int offset;
  unsigned_long mask [4];
  uint exclude [13];
  char *ascii_local;
  int complm_local;
  unsigned_long sum_local;
  
  memcpy(mask + 3,&DAT_0028ade0,0x34);
  mask[0] = 0xff0000;
  mask[1] = 0xff00;
  mask[2] = 0xff;
  _quotient = sum;
  if (complm != 0) {
    _quotient = 0xffffffff - sum;
  }
  for (kk = 0; kk < 4; kk = kk + 1) {
    iVar1 = (int)((_quotient & mask[(long)kk + -1]) >> (0x18U - (char)(kk << 3) & 0x3f));
    ch[3] = iVar1 % 4;
    asc[0x1c] = '\0';
    asc[0x1d] = '\0';
    asc[0x1e] = '\0';
    asc[0x1f] = '\0';
    for (; (int)asc._28_4_ < 4; asc._28_4_ = asc._28_4_ + 1) {
      (&ii)[(int)asc._28_4_] = iVar1 / 4 + 0x30;
    }
    ii = ch[3] + ii;
    jj = 1;
    while (jj != 0) {
      jj = 0;
      asc[0x18] = '\0';
      asc[0x19] = '\0';
      asc[0x1a] = '\0';
      asc[0x1b] = '\0';
      for (; (int)asc._24_4_ < 0xd; asc._24_4_ = asc._24_4_ + 1) {
        asc[0x1c] = '\0';
        asc[0x1d] = '\0';
        asc[0x1e] = '\0';
        asc[0x1f] = '\0';
        for (; (int)asc._28_4_ < 4; asc._28_4_ = asc._28_4_ + 2) {
          if ((((&ii)[(int)asc._28_4_] & 0xffU) == exclude[(long)(int)asc._24_4_ + -2]) ||
             (((&ii)[asc._28_4_ + 1] & 0xffU) == exclude[(long)(int)asc._24_4_ + -2])) {
            (&ii)[(int)asc._28_4_] = (&ii)[(int)asc._28_4_] + 1;
            (&ii)[asc._28_4_ + 1] = (&ii)[asc._28_4_ + 1] + -1;
            jj = jj + 1;
          }
        }
      }
    }
    asc[0x1c] = '\0';
    asc[0x1d] = '\0';
    asc[0x1e] = '\0';
    asc[0x1f] = '\0';
    for (; (int)asc._28_4_ < 4; asc._28_4_ = asc._28_4_ + 1) {
      acStack_d8[asc._28_4_ * 4 + kk] = (char)(&ii)[(int)asc._28_4_];
    }
  }
  for (kk = 0; kk < 0x10; kk = kk + 1) {
    ascii[kk] = acStack_d8[(kk + 0xf) % 0x10];
  }
  ascii[0x10] = '\0';
  return;
}

Assistant:

void ffesum(unsigned long sum,  /* I - accumulated checksum                */
           int complm,          /* I - = 1 to encode complement of the sum */
           char *ascii)         /* O - 16-char ASCII encoded checksum      */
/*
    encode the 32 bit checksum by converting every 
    2 bits of each byte into an ASCII character (32 bit word encoded 
    as 16 character string).   Only ASCII letters and digits are used
    to encode the values (no ASCII punctuation characters).

    If complm=TRUE, then the complement of the sum will be encoded.

    This routine is based on the C algorithm developed by Rob
    Seaman at NOAO that was presented at the 1994 ADASS conference,
    published in the Astronomical Society of the Pacific Conference Series.
*/
{
    unsigned int exclude[13] = { 0x3a, 0x3b, 0x3c, 0x3d, 0x3e, 0x3f, 0x40,
                                       0x5b, 0x5c, 0x5d, 0x5e, 0x5f, 0x60 };
    unsigned long mask[4] = { 0xff000000, 0xff0000, 0xff00, 0xff  };

    int offset = 0x30;     /* ASCII 0 (zero) */

    unsigned long value;
    int byte, quotient, remainder, ch[4], check, ii, jj, kk;
    char asc[32];

    if (complm)
        value = 0xFFFFFFFF - sum;   /* complement each bit of the value */
    else
        value = sum;

    for (ii = 0; ii < 4; ii++)
    {
        byte = (value & mask[ii]) >> (24 - (8 * ii));
        quotient = byte / 4 + offset;
        remainder = byte % 4;
        for (jj = 0; jj < 4; jj++)
            ch[jj] = quotient;

        ch[0] += remainder;

        for (check = 1; check;)   /* avoid ASCII  punctuation */
            for (check = 0, kk = 0; kk < 13; kk++)
                for (jj = 0; jj < 4; jj += 2)
                    if ((unsigned char) ch[jj] == exclude[kk] ||
                        (unsigned char) ch[jj+1] == exclude[kk])
                    {
                        ch[jj]++;
                        ch[jj+1]--;
                        check++;
                    }

        for (jj = 0; jj < 4; jj++)        /* assign the bytes */
            asc[4*jj+ii] = ch[jj];
    }

    for (ii = 0; ii < 16; ii++)       /* shift the bytes 1 to the right */
        ascii[ii] = asc[(ii+15)%16];

    ascii[16] = '\0';
}